

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_distributed_random_value_generation.cc
# Opt level: O0

bool __thiscall
sptk::NormalDistributedRandomValueGeneration::Get
          (NormalDistributedRandomValueGeneration *this,double *output)

{
  bool bVar1;
  double *in_RSI;
  long in_RDI;
  double dVar2;
  undefined1 local_1;
  
  if (in_RSI == (double *)0x0) {
    local_1 = false;
  }
  else {
    if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
      *(undefined1 *)(in_RDI + 0x18) = 1;
      *in_RSI = *(double *)(in_RDI + 0x28) * *(double *)(in_RDI + 0x30);
    }
    else {
      *(undefined1 *)(in_RDI + 0x18) = 0;
      do {
        dVar2 = anon_unknown.dwarf_44b0::PseudoRandomGeneration((uint64_t *)(in_RDI + 0x10));
        *(double *)(in_RDI + 0x20) = dVar2 + dVar2 + -1.0;
        dVar2 = anon_unknown.dwarf_44b0::PseudoRandomGeneration((uint64_t *)(in_RDI + 0x10));
        *(double *)(in_RDI + 0x28) = dVar2 + dVar2 + -1.0;
        *(double *)(in_RDI + 0x30) =
             *(double *)(in_RDI + 0x20) * *(double *)(in_RDI + 0x20) +
             *(double *)(in_RDI + 0x28) * *(double *)(in_RDI + 0x28);
        bVar1 = true;
        if ((*(double *)(in_RDI + 0x30) != 0.0) || (NAN(*(double *)(in_RDI + 0x30)))) {
          bVar1 = 1.0 <= *(double *)(in_RDI + 0x30);
        }
      } while (bVar1);
      dVar2 = log(*(double *)(in_RDI + 0x30));
      dVar2 = sqrt((dVar2 * -2.0) / *(double *)(in_RDI + 0x30));
      *(double *)(in_RDI + 0x30) = dVar2;
      *in_RSI = *(double *)(in_RDI + 0x20) * *(double *)(in_RDI + 0x30);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool NormalDistributedRandomValueGeneration::Get(double* output) {
  if (NULL == output) {
    return false;
  }

  if (switch_) {
    switch_ = false;
    do {
      r1_ = 2.0 * PseudoRandomGeneration(&(next_)) - 1.0;
      r2_ = 2.0 * PseudoRandomGeneration(&(next_)) - 1.0;
      s_ = r1_ * r1_ + r2_ * r2_;
    } while (0.0 == s_ || 1.0 <= s_);
    s_ = std::sqrt(-2.0 * std::log(s_) / s_);
    *output = r1_ * s_;
  } else {
    switch_ = true;
    *output = r2_ * s_;
  }

  return true;
}